

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O0

bool __thiscall Func::DoLoopFastPaths(Func *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  byte local_19;
  Func *this_local;
  
  bVar1 = IsSimpleJit(this);
  if ((!bVar1) || (local_19 = 0, (DAT_01eafdac & 1) != 0)) {
    uVar2 = GetSourceContextId(this);
    uVar3 = GetLocalFunctionId(this);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FastPathPhase,uVar2,uVar3);
    local_19 = 0;
    if (!bVar1) {
      uVar2 = GetSourceContextId(this);
      uVar3 = GetLocalFunctionId(this);
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,LoopFastPathPhase,uVar2,uVar3);
      local_19 = bVar1 ^ 0xff;
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool DoLoopFastPaths() const
    {
        return
            (!IsSimpleJit() || CONFIG_FLAG(NewSimpleJit)) &&
            !PHASE_OFF(Js::FastPathPhase, this) &&
            !PHASE_OFF(Js::LoopFastPathPhase, this);
    }